

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase112::run(TestCase112 *this)

{
  Reader reader;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Reader RVar2;
  size_t in_stack_fffffffffffffba8;
  int local_428;
  bool local_421;
  int local_420;
  bool _kj_shouldLog_4;
  SegmentReader *pSStack_418;
  bool _kj_shouldLog_3;
  SegmentReader *pSStack_410;
  CapTableReader *local_408;
  void *pvStack_400;
  WirePointer *local_3f8;
  StructDataBitCount SStack_3f0;
  StructPointerCount SStack_3ec;
  undefined2 uStack_3ea;
  undefined1 auStack_3e0 [8];
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  bool local_389;
  undefined1 auStack_388 [7];
  bool _kj_shouldLog_2;
  size_t local_380;
  undefined1 local_378 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  int local_330;
  bool _kj_shouldLog_1;
  undefined1 local_328 [7];
  bool _kj_shouldLog;
  undefined1 local_2f0 [8];
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Pipeline local_2a0;
  Client local_278;
  Client local_260;
  undefined1 local_248 [8];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Pipeline local_1c0;
  Client local_198;
  undefined1 local_180 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  Client local_100;
  Maybe<capnp::MessageSize> local_e8;
  undefined1 local_d0 [8];
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  undefined1 local_88 [8];
  Client client;
  int local_68;
  int chainedCallCount;
  int callCount;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase112 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  local_68 = 0;
  client._20_4_ = 0;
  kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&request.hook.ptr,&local_68);
  capnproto_test::capnp::test::TestPipeline::Client::Client<capnp::_::TestPipelineImpl,void>
            ((Client *)local_88,(Own<capnp::_::TestPipelineImpl> *)&request.hook.ptr);
  kj::Own<capnp::_::TestPipelineImpl>::~Own((Own<capnp::_::TestPipelineImpl> *)&request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_e8,(void *)0x0);
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_d0,(Client *)local_88,&local_e8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_e8);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setN((Builder *)local_d0,0xea);
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)&promise.super_Pipeline._typeless.ops.disposer,(int *)&client.field_0x14);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&local_100,
             (Own<capnp::_::TestInterfaceImpl> *)&promise.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            ((Builder *)local_d0,&local_100);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_100);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own
            ((Own<capnp::_::TestInterfaceImpl> *)&promise.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)&pipelineRequest.hook.ptr,(int)local_d0,__buf,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_1c0,
             (Pipeline *)
             &promise.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
              .super_PromiseBase.node.ptr);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_198,&local_1c0);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_180,&local_198,
             (Maybe<capnp::MessageSize> *)&pipelinePromise.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_198);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_1c0);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_180,0x141);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&pipelineRequest2.hook.ptr,(int)local_180,__buf_00,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_2a0,
             (Pipeline *)
             &promise.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
              .super_PromiseBase.node.ptr);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_278,&local_2a0);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            (&local_260,(Client *)(local_278._vptr_Client[-3] + (long)&local_278._vptr_Client));
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_248,&local_260,
             (Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestExtends::Client::~Client(&local_260);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_278);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_2a0);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_2f0,(int)local_248,__buf_01,in_RCX,in_R8D);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_328,
             (void *)0x0);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &pipelineRequest.hook.ptr,
             (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_328);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_328);
  if (local_68 != 0) {
    _kj_shouldLog_1 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_1 != false) {
      local_330 = 0;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x87,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",&local_330,&local_68);
      _kj_shouldLog_1 = false;
    }
  }
  if (client._20_4_ != 0) {
    response.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response.hook.ptr._7_1_ != false) {
      response.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x88,ERROR,
                 "\"failed: expected \" \"(0) == (chainedCallCount)\", 0, chainedCallCount",
                 (char (*) [43])"failed: expected (0) == (chainedCallCount)",
                 (int *)&response.hook.ptr,(int *)&client.field_0x14);
      response.hook.ptr._7_1_ = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_378,&pipelineRequest2.hook.ptr);
  _auStack_388 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_378);
  bVar1 = kj::operator==("bar",(StringPtr *)auStack_388);
  if (!bVar1) {
    local_389 = kj::_::Debug::shouldLog(ERROR);
    while (local_389 != false) {
      RVar2 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_378);
      in_stack_fffffffffffffba8 = RVar2.super_StringPtr.content.size_;
      response2.hook.ptr = RVar2.super_StringPtr.content.ptr;
      kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x8b,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()"
                 ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
                 (char (*) [4])0xa54964,(Reader *)&response2.hook.ptr);
      local_389 = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)auStack_3e0,
             local_2f0);
  local_3f8 = response2.super_Reader._reader.pointers;
  SStack_3f0 = response2.super_Reader._reader.dataSize;
  SStack_3ec = response2.super_Reader._reader.pointerCount;
  uStack_3ea = response2.super_Reader._reader._38_2_;
  local_408 = response2.super_Reader._reader.capTable;
  pvStack_400 = response2.super_Reader._reader.data;
  pSStack_418 = (SegmentReader *)auStack_3e0;
  pSStack_410 = response2.super_Reader._reader.segment;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffba8;
  checkTestMessage(reader);
  if (local_68 != 3) {
    _kj_shouldLog_4 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_420 = 3;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x90,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
                 (char (*) [36])"failed: expected (3) == (callCount)",&local_420,&local_68);
      _kj_shouldLog_4 = false;
    }
  }
  if (client._20_4_ != 1) {
    local_421 = kj::_::Debug::shouldLog(ERROR);
    while (local_421 != false) {
      local_428 = 1;
      kj::_::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"(1) == (chainedCallCount)\", 1, chainedCallCount",
                 (char (*) [43])"failed: expected (1) == (chainedCallCount)",&local_428,
                 (int *)&client.field_0x14);
      local_421 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestAllTypes>::~Response
            ((Response<capnproto_test::capnp::test::TestAllTypes> *)auStack_3e0);
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_378);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)local_2f0);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::~Request((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_248);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &pipelineRequest2.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_180);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &pipelineRequest.hook.ptr);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::~Request((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_d0);
  capnproto_test::capnp::test::TestPipeline::Client::~Client((Client *)local_88);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, Pipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  test::TestPipeline::Client client(kj::heap<TestPipelineImpl>(callCount));

  auto request = client.getCapRequest();
  request.setN(234);
  request.setInCap(test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
  pipelineRequest.setI(321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = promise.getOutBox().getCap().castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.getX());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}